

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int get_num_opt(archive_write *a,int *num,int high,int low,char *key,char *value)

{
  uint in_ECX;
  uint in_EDX;
  int *in_RSI;
  archive *in_RDI;
  undefined8 in_R8;
  char *in_R9;
  int neg;
  int data;
  char *p;
  int local_3c;
  char *local_38;
  int local_4;
  
  local_3c = 0;
  if (in_R9 == (char *)0x0) {
    archive_set_error(in_RDI,-1,"Invalid value(empty) for option ``%s\'\'",in_R8);
    local_4 = -0x1e;
  }
  else {
    local_38 = in_R9;
    if (*in_R9 == '-') {
      local_38 = in_R9 + 1;
    }
    for (; *local_38 != '\0'; local_38 = local_38 + 1) {
      if ((*local_38 < '0') || ('9' < *local_38)) {
        archive_set_error(in_RDI,-1,"Invalid value for option ``%s\'\'",in_R8);
        return -0x1e;
      }
      local_3c = local_3c * 10 + (int)*local_38 + -0x30;
      if ((int)in_EDX < local_3c) {
        archive_set_error(in_RDI,-1,"Invalid value(over %d) for option ``%s\'\'",(ulong)in_EDX,in_R8
                         );
        return -0x1e;
      }
      if (local_3c < (int)in_ECX) {
        archive_set_error(in_RDI,-1,"Invalid value(under %d) for option ``%s\'\'",(ulong)in_ECX,
                          in_R8);
        return -0x1e;
      }
    }
    if (*in_R9 == '-') {
      local_3c = -local_3c;
    }
    *in_RSI = local_3c;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
get_num_opt(struct archive_write *a, int *num, int high, int low,
    const char *key, const char *value)
{
	const char *p = value;
	int data = 0;
	int neg = 0;

	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid value(empty) for option ``%s''", key);
		return (ARCHIVE_FATAL);
	}
	if (*p == '-') {
		neg = 1;
		p++;
	}
	while (*p) {
		if (*p >= '0' && *p <= '9')
			data = data * 10 + *p - '0';
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value for option ``%s''", key);
			return (ARCHIVE_FATAL);
		}
		if (data > high) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(over %d) for "
			    "option ``%s''", high, key);
			return (ARCHIVE_FATAL);
		}
		if (data < low) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(under %d) for "
			    "option ``%s''", low, key);
			return (ARCHIVE_FATAL);
		}
		p++;
	}
	if (neg)
		data *= -1;
	*num = data;

	return (ARCHIVE_OK);
}